

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void ly_path_predicates_free(ly_ctx *ctx,ly_path_predicate *predicates)

{
  ly_path_pred_type lVar1;
  lyd_node **local_50;
  undefined1 local_40 [8];
  lysf_ctx fctx;
  uint64_t u;
  ly_path_predicate *predicates_local;
  ly_ctx *ctx_local;
  
  memset(local_40,0,0x20);
  if (predicates != (ly_path_predicate *)0x0) {
    fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
    local_40 = (undefined1  [8])ctx;
    while( true ) {
      if (predicates == (ly_path_predicate *)0x0) {
        local_50 = (lyd_node **)0x0;
      }
      else {
        local_50 = *(lyd_node ***)((long)&predicates[-1].field_1 + 0x28);
      }
      if (local_50 <= fctx.ext_set.field_2.dnodes) break;
      lVar1 = predicates[(long)fctx.ext_set.field_2].type;
      if (lVar1 != LY_PATH_PREDTYPE_POSITION) {
        if (lVar1 - LY_PATH_PREDTYPE_LIST < 2) {
          if (*(long *)((long)&predicates[(long)fctx.ext_set.field_2].field_1 + 0x10) != 0) {
            (**(code **)(*(long *)(*(long *)((long)&predicates[(long)fctx.ext_set.field_2].field_1 +
                                            0x10) + 0x10) + 0x38))
                      (ctx,(undefined1 *)((long)&predicates[(long)fctx.ext_set.field_2].field_1 + 8)
                      );
            lysc_type_free((lysf_ctx *)local_40,
                           *(lysc_type **)
                            ((long)&predicates[(long)fctx.ext_set.field_2].field_1 + 0x10));
          }
        }
        else if (lVar1 == LY_PATH_PREDTYPE_LIST_VAR) {
          free(*(void **)((long)&predicates[(long)fctx.ext_set.field_2].field_1 + 8));
        }
      }
      fctx.ext_set.field_2.dnodes = fctx.ext_set.field_2.dnodes + 1;
    }
    if (predicates != (ly_path_predicate *)0x0) {
      free((void *)((long)&predicates[-1].field_1 + 0x28));
    }
  }
  return;
}

Assistant:

void
ly_path_predicates_free(const struct ly_ctx *ctx, struct ly_path_predicate *predicates)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    if (!predicates) {
        return;
    }

    LY_ARRAY_FOR(predicates, u) {
        switch (predicates[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* nothing to free */
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            if (predicates[u].value.realtype) {
                predicates[u].value.realtype->plugin->free(ctx, &predicates[u].value);
                lysc_type_free(&fctx, (struct lysc_type *)predicates[u].value.realtype);
            }
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            free(predicates[u].variable);
            break;
        }
    }
    LY_ARRAY_FREE(predicates);
}